

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseExtensions
          (Parser *this,DescriptorProto *message,LocationRecorder *extensions_location,
          FileDescriptorProto *containing_file)

{
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar4;
  ExtensionRangeOptions *from;
  ExtensionRangeOptions *this_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
  *pVVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
  *from_00;
  pointer piVar6;
  int index;
  int j;
  int iVar7;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  int local_b8;
  int start;
  LocationRecorder start_location;
  LocationRecorder location;
  Token start_token;
  
  text._M_str = "extensions";
  text._M_len = 10;
  bVar1 = Consume(this,text);
  if (bVar1) {
    index = *(int *)((long)&message->field_0 + 0x58);
    this_00 = &(message->field_0)._impl_.extension_range_;
    do {
      LocationRecorder::LocationRecorder
                (&location,extensions_location,*(int *)((long)&message->field_0 + 0x58));
      pVVar4 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                         (&this_00->super_RepeatedPtrFieldBase);
      LocationRecorder::RecordLegacyLocation(&location,&pVVar4->super_Message,NUMBER);
      start_token.text._M_dataplus._M_p = (pointer)&start_token.text.field_2;
      start_token.text._M_string_length = 0;
      start_token.text.field_2._M_local_buf[0] = '\0';
      LocationRecorder::LocationRecorder(&start_location,&location,1);
      io::Tokenizer::Token::operator=(&start_token,&this->input_->current_);
      bVar1 = ConsumeInteger(this,&start,(ErrorMaker)ZEXT816(0x3706cc));
      iVar2 = start;
      if (!bVar1) {
LAB_001bd043:
        LocationRecorder::~LocationRecorder(&start_location);
        std::__cxx11::string::~string((string *)&start_token.text);
        LocationRecorder::~LocationRecorder(&location);
        return false;
      }
      if (start == 0x7fffffff) {
        RecordError(this,(ErrorMaker)ZEXT816(0x3706e9));
        goto LAB_001bd043;
      }
      LocationRecorder::~LocationRecorder(&start_location);
      text_00._M_str = "to";
      text_00._M_len = 2;
      bVar1 = TryConsume(this,text_00);
      if (bVar1) {
        LocationRecorder::LocationRecorder(&start_location,&location,2);
        text_01._M_str = "max";
        text_01._M_len = 3;
        bVar1 = TryConsume(this,text_01);
        iVar7 = -2;
        if (!bVar1) {
          bVar1 = ConsumeInteger(this,&local_b8,(ErrorMaker)ZEXT816(0x370709));
          if (!bVar1) goto LAB_001bd043;
          iVar7 = local_b8;
          if (local_b8 == 0x7fffffff) {
            RecordError(this,(ErrorMaker)ZEXT816(0x3706e9));
            goto LAB_001bd043;
          }
        }
        LocationRecorder::~LocationRecorder(&start_location);
      }
      else {
        LocationRecorder::LocationRecorder(&start_location,&location,2);
        LocationRecorder::StartAt(&start_location,&start_token);
        LocationRecorder::EndAt(&start_location,&start_token);
        LocationRecorder::~LocationRecorder(&start_location);
        iVar7 = iVar2;
      }
      (pVVar4->field_0)._impl_.start_ = iVar2;
      (pVVar4->field_0)._impl_.end_ = iVar7 + 1;
      *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 6;
      std::__cxx11::string::~string((string *)&start_token.text);
      LocationRecorder::~LocationRecorder(&location);
      text_02._M_str = ",";
      text_02._M_len = 1;
      bVar1 = TryConsume(this,text_02);
    } while (bVar1);
    text_03._M_str = "[";
    text_03._M_len = 1;
    bVar1 = LookingAt(this,text_03);
    if (!bVar1) {
LAB_001bd143:
      text_07._M_str = ";";
      text_07._M_len = 1;
      bVar1 = ConsumeEndOfDeclaration(this,text_07,extensions_location);
      return bVar1;
    }
    iVar2 = LocationRecorder::CurrentPathSize(extensions_location);
    SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)&start_token);
    pVVar4 = internal::RepeatedPtrFieldBase::
             Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                       (&this_00->super_RepeatedPtrFieldBase,index);
    from = DescriptorProto_ExtensionRange::mutable_options(pVVar4);
    LocationRecorder::LocationRecorder
              (&location,extensions_location,0,(SourceCodeInfo *)&start_token);
    LocationRecorder::LocationRecorder(&start_location,&location,3);
    text_04._M_str = "[";
    text_04._M_len = 1;
    bVar1 = Consume(this,text_04);
    if (bVar1) {
      do {
        bVar1 = ParseOption(this,&from->super_Message,&start_location,containing_file,
                            OPTION_ASSIGNMENT);
        if (!bVar1) goto LAB_001bd075;
        text_05._M_str = ",";
        text_05._M_len = 1;
        bVar1 = TryConsume(this,text_05);
      } while (bVar1);
      text_06._M_str = "]";
      text_06._M_len = 1;
      bVar1 = Consume(this,text_06);
      LocationRecorder::~LocationRecorder(&start_location);
      LocationRecorder::~LocationRecorder(&location);
      iVar7 = index;
      if (bVar1) {
        while( true ) {
          iVar7 = iVar7 + 1;
          iVar3 = *(int *)((long)&message->field_0 + 0x58);
          if (iVar3 <= iVar7) break;
          pVVar4 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                             (&this_00->super_RepeatedPtrFieldBase,iVar7);
          this_01 = DescriptorProto_ExtensionRange::mutable_options(pVVar4);
          ExtensionRangeOptions::CopyFrom(this_01,from);
        }
        for (; index < iVar3; index = index + 1) {
          for (iVar7 = 0; iVar7 < start_token.end_column; iVar7 = iVar7 + 1) {
            pVVar5 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                               ((RepeatedPtrFieldBase *)&start_token.line,iVar7);
            iVar3 = RepeatedField<int>::size(&(pVVar5->field_0)._impl_.path_);
            if (iVar3 != iVar2 + 1) {
              pVVar5 = internal::RepeatedPtrFieldBase::
                       Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                                 (&(this->source_code_info_->field_0)._impl_.location_.
                                   super_RepeatedPtrFieldBase);
              from_00 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                                  ((RepeatedPtrFieldBase *)&start_token.line,iVar7);
              SourceCodeInfo_Location::CopyFrom(pVVar5,from_00);
              piVar6 = RepeatedField<int>::Mutable(&(pVVar5->field_0)._impl_.path_,iVar2);
              *piVar6 = index;
            }
          }
          iVar3 = *(int *)((long)&message->field_0 + 0x58);
        }
        SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)&start_token);
        goto LAB_001bd143;
      }
    }
    else {
LAB_001bd075:
      LocationRecorder::~LocationRecorder(&start_location);
      LocationRecorder::~LocationRecorder(&location);
    }
    SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)&start_token);
  }
  return false;
}

Assistant:

bool Parser::ParseExtensions(DescriptorProto* message,
                             const LocationRecorder& extensions_location,
                             const FileDescriptorProto* containing_file) {
  // Parse the declaration.
  DO(Consume("extensions"));

  int old_range_size = message->extension_range_size();

  do {
    // Note that kExtensionRangeFieldNumber was already pushed by the parent.
    LocationRecorder location(extensions_location,
                              message->extension_range_size());

    DescriptorProto::ExtensionRange* range = message->add_extension_range();
    location.RecordLegacyLocation(range,
                                  DescriptorPool::ErrorCollector::NUMBER);

    int start, end;
    io::Tokenizer::Token start_token;

    {
      LocationRecorder start_location(
          location, DescriptorProto::ExtensionRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, "Expected field number range."));

      if (start == std::numeric_limits<int>::max()) {
        RecordError("Field number out of bounds.");
        return false;
      }
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));

        if (end == std::numeric_limits<int>::max()) {
          RecordError("Field number out of bounds.");
          return false;
        }
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
  } while (TryConsume(","));

  if (LookingAt("[")) {
    int range_number_index = extensions_location.CurrentPathSize();
    SourceCodeInfo info;

    // Parse extension range options in the first range.
    ExtensionRangeOptions* options =
        message->mutable_extension_range(old_range_size)->mutable_options();

    {
      LocationRecorder index_location(
          extensions_location, 0 /* we fill this in w/ actual index below */,
          &info);
      LocationRecorder location(
          index_location, DescriptorProto::ExtensionRange::kOptionsFieldNumber);
      DO(Consume("["));

      do {
        DO(ParseOption(options, location, containing_file, OPTION_ASSIGNMENT));
      } while (TryConsume(","));

      DO(Consume("]"));
    }

    // Then copy the extension range options to all of the other ranges we've
    // parsed.
    for (int i = old_range_size + 1; i < message->extension_range_size(); i++) {
      *message->mutable_extension_range(i)->mutable_options() = *options;
    }
    // and copy source locations to the other ranges, too
    for (int i = old_range_size; i < message->extension_range_size(); i++) {
      for (int j = 0; j < info.location_size(); j++) {
        if (info.location(j).path_size() == range_number_index + 1) {
          // this location's path is up to the extension range index, but
          // doesn't include options; so it's redundant with location above
          continue;
        }
        SourceCodeInfo_Location* dest = source_code_info_->add_location();
        *dest = info.location(j);
        dest->set_path(range_number_index, i);
      }
    }
  }

  DO(ConsumeEndOfDeclaration(";", &extensions_location));
  return true;
}